

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O2

void __thiscall ncnn::ObjectsManager::ObjectsManager(ObjectsManager *this,size_t steps)

{
  SafeOrderList<ncnn::ObjectBox> *this_00;
  ulong uVar1;
  
  uVar1 = 1;
  if (steps < 0x65) {
    uVar1 = 100 / steps;
  }
  (this->object_boxs_table).
  super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->object_boxs_table).
  super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->object_boxs_table).
  super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->step = uVar1;
  uVar1 = (ulong)(byte)(100 / (byte)uVar1);
  this->prob_steps = uVar1;
  std::
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ::resize(&this->object_boxs_table,uVar1);
  for (uVar1 = 0; uVar1 < this->prob_steps; uVar1 = uVar1 + 1) {
    this_00 = (SafeOrderList<ncnn::ObjectBox> *)operator_new(0x48);
    SafeOrderList<ncnn::ObjectBox>::SafeOrderList(this_00,object_compare);
    (this->object_boxs_table).
    super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar1] = this_00;
  }
  return;
}

Assistant:

ObjectsManager::ObjectsManager(size_t steps) : object_boxs_table()
{
    step = prob_steps_MAX / steps;
    step = step <= 0 ? 1 : step;
    prob_steps = prob_steps_MAX / step;
    object_boxs_table.resize(prob_steps);
    for (size_t i = 0; i < prob_steps; i++)
    {
        object_boxs_table[i] = new TObjectBoxs(object_compare);
    }
}